

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_aload_0(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value operand;
  ValueType VStack_2c;
  Value value;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  operand = Frame::getLocalVariableValue(this_01,0);
  VStack_2c = operand.type;
  if (VStack_2c == REFERENCE) {
    Frame::pushIntoOperandStack(this_01,operand);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value.type == ValueType::REFERENCE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x36b,"void ExecutionEngine::i_aload_0()");
}

Assistant:

void ExecutionEngine::i_aload_0() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value = topFrame->getLocalVariableValue(0);
    assert(value.type == ValueType::REFERENCE);
    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}